

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t path_excluded(archive_match *a,wchar_t mbs,void *pathname)

{
  void *in_RDX;
  wchar_t in_ESI;
  match *in_RDI;
  wchar_t r;
  match *matched;
  match *match;
  char *local_30;
  match *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar1;
  
  if (in_RDI == (match *)0x0) {
    wVar1 = L'\0';
  }
  else {
    local_30 = (char *)0x0;
    for (local_28 = (match *)in_RDI[1].pattern.aes_utf8.s; local_28 != (match *)0x0;
        local_28 = local_28->next) {
      if ((*(int *)((long)local_28 + 8) == 0) &&
         (wVar1 = match_path_inclusion
                            ((archive_match *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             in_ESI,in_RDX), wVar1 != L'\0')) {
        if (wVar1 < L'\0') {
          return wVar1;
        }
        *(int *)((long)&in_RDI[1].pattern.aes_utf8.buffer_length + 4) =
             *(int *)((long)&in_RDI[1].pattern.aes_utf8.buffer_length + 4) + -1;
        *(int *)((long)local_28 + 8) = *(int *)((long)local_28 + 8) + 1;
        local_30 = (char *)local_28;
      }
    }
    for (local_28 = in_RDI[1].next; local_28 != (match *)0x0; local_28 = local_28->next) {
      wVar1 = match_path_exclusion
                        ((archive_match *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_ESI
                         ,in_RDX);
      if (wVar1 != L'\0') {
        return wVar1;
      }
    }
    if (local_30 == (char *)0x0) {
      for (local_28 = (match *)in_RDI[1].pattern.aes_utf8.s; local_28 != (match *)0x0;
          local_28 = local_28->next) {
        if ((0 < *(int *)((long)local_28 + 8)) &&
           (wVar1 = match_path_inclusion
                              ((archive_match *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               in_ESI,in_RDX), wVar1 != L'\0')) {
          if (wVar1 < L'\0') {
            return wVar1;
          }
          *(int *)((long)local_28 + 8) = *(int *)((long)local_28 + 8) + 1;
          return L'\0';
        }
      }
      if (in_RDI[1].pattern.aes_utf8.s == (char *)0x0) {
        wVar1 = L'\0';
      }
      else {
        wVar1 = L'\x01';
      }
    }
    else {
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
path_excluded(struct archive_match *a, int mbs, const void *pathname)
{
	struct match *match;
	struct match *matched;
	int r;

	if (a == NULL)
		return (0);

	/* Mark off any unmatched inclusions. */
	/* In particular, if a filename does appear in the archive and
	 * is explicitly included and excluded, then we don't report
	 * it as missing even though we don't extract it.
	 */
	matched = NULL;
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		if (match->matches == 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			a->inclusions.unmatched_count--;
			match->matches++;
			matched = match;
		}
	}

	/* Exclusions take priority */
	for (match = a->exclusions.first; match != NULL;
	    match = match->next){
		r = match_path_exclusion(a, match, mbs, pathname);
		if (r)
			return (r);
	}

	/* It's not excluded and we found an inclusion above, so it's
	 * included. */
	if (matched != NULL)
		return (0);


	/* We didn't find an unmatched inclusion, check the remaining ones. */
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		/* We looked at previously-unmatched inclusions already. */
		if (match->matches > 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			match->matches++;
			return (0);
		}
	}

	/* If there were inclusions, default is to exclude. */
	if (a->inclusions.first != NULL)
	    return (1);

	/* No explicit inclusions, default is to match. */
	return (0);
}